

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_validation.c
# Opt level: O0

REF_STATUS ref_validation_cell_node(REF_GRID ref_grid)

{
  REF_NODE pRVar1;
  bool bVar2;
  REF_STATUS RVar3;
  bool bVar4;
  REF_STATUS ref_private_macro_code_rss;
  REF_STATUS ref_private_macro_code_rsb;
  REF_BOOL has_local;
  REF_INT nodes [27];
  int local_34;
  int local_30;
  REF_INT node;
  REF_INT cell;
  REF_INT group;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_GRID ref_grid_local;
  
  pRVar1 = ref_grid->node;
  node = 0;
  _cell = ref_grid->cell[0];
  do {
    if (0xf < node) {
      return 0;
    }
    for (local_30 = 0; local_30 < _cell->max; local_30 = local_30 + 1) {
      RVar3 = ref_cell_nodes(_cell,local_30,&ref_private_macro_code_rsb);
      if (RVar3 == 0) {
        bVar4 = false;
        for (local_34 = 0; local_34 < _cell->node_per; local_34 = local_34 + 1) {
          if ((((&ref_private_macro_code_rsb)[local_34] < 0) ||
              (ref_grid->node->max <= (&ref_private_macro_code_rsb)[local_34])) ||
             (ref_grid->node->global[(&ref_private_macro_code_rsb)[local_34]] < 0)) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                   ,0x18a,"ref_validation_cell_node",1,"cell with invalid node");
            printf("group %d node_per %d\n",(ulong)(uint)node,(ulong)(uint)_cell->node_per);
            return 1;
          }
          bVar2 = !bVar4;
          bVar4 = true;
          if (bVar2) {
            bVar4 = ref_grid->mpi->id == pRVar1->part[(&ref_private_macro_code_rsb)[local_34]];
          }
        }
        if (!bVar4) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                 ,400,"ref_validation_cell_node",1,"cell with all ghost nodes");
          return 1;
        }
      }
    }
    node = node + 1;
    _cell = ref_grid->cell[node];
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_validation_cell_node(REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT group;
  REF_INT cell, node, nodes[REF_CELL_MAX_SIZE_PER];
  REF_BOOL has_local;

  each_ref_grid_all_ref_cell(ref_grid, group, ref_cell) {
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      has_local = REF_FALSE;
      for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
        if (!ref_node_valid(ref_grid_node(ref_grid), nodes[node])) {
          RSB(REF_FAILURE, "cell with invalid node", {
            printf("group %d node_per %d\n", group,
                   ref_cell_node_per(ref_cell));
          });
        }
        has_local = has_local || (ref_mpi_rank(ref_grid_mpi(ref_grid)) ==
                                  ref_node_part(ref_node, nodes[node]));
      }
      if (!has_local) {
        RSS(REF_FAILURE, "cell with all ghost nodes");
      }
    }
  }

  return REF_SUCCESS;
}